

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O1

bool __thiscall Omega_h::StateRowLess::operator()(StateRowLess *this,int *a,int *b)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  ConstRef pvVar4;
  undefined8 uVar5;
  bool bVar6;
  char *pcVar7;
  int iVar8;
  
  iVar1 = *a;
  if ((long)iVar1 < 0) {
LAB_002c553a:
    pcVar7 = "0 <= i";
    uVar5 = 0x1d;
  }
  else {
    piVar3 = (this->accepted->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = (int)((ulong)((long)(this->accepted->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    if (iVar1 < iVar8) {
      iVar2 = *b;
      if ((long)iVar2 < 0) goto LAB_002c553a;
      if (iVar2 < iVar8) {
        if (piVar3[iVar1] == piVar3[iVar2]) {
          iVar1 = this->table->ncols;
          iVar8 = 0;
          if (0 < iVar1) {
            do {
              pvVar4 = at<int>(this->table,*a,iVar8);
              iVar2 = *pvVar4;
              pvVar4 = at<int>(this->table,*b,iVar8);
              if (iVar2 != *pvVar4) {
                return iVar2 < *pvVar4;
              }
              iVar8 = iVar8 + 1;
            } while (iVar1 != iVar8);
          }
          bVar6 = false;
        }
        else {
          bVar6 = piVar3[iVar1] < piVar3[iVar2];
        }
        return bVar6;
      }
    }
    pcVar7 = "i < int(v.size())";
    uVar5 = 0x1e;
  }
  fail("assertion %s failed at %s +%d\n",pcVar7,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
       ,uVar5);
}

Assistant:

bool operator()(int const& a, int const& b) const {
    auto aa = at(accepted, a);
    auto ab = at(accepted, b);
    if (aa != ab) return aa < ab;
    for (int symbol = 0, ncols = get_ncols(table); symbol < ncols; ++symbol) {
      auto ea = at(table, a, symbol);
      auto eb = at(table, b, symbol);
      if (ea != eb) return ea < eb;
    }
    return false;
  }